

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O0

mat<2UL,_2UL> * __thiscall
mat<3UL,_3UL>::get_minor
          (mat<2UL,_2UL> *__return_storage_ptr__,mat<3UL,_3UL> *this,size_t row,size_t col)

{
  vec<2UL,_double> *this_00;
  double *pdVar1;
  size_t idx;
  size_t i_00;
  double dVar2;
  size_t local_60;
  ulong local_50;
  size_t local_30;
  size_t j;
  size_t i;
  size_t col_local;
  size_t row_local;
  mat<3UL,_3UL> *this_local;
  
  mat<2UL,_2UL>::mat(__return_storage_ptr__);
  j = 2;
  idx = j;
  while (j = idx, idx = j - 1, j != 0) {
    local_30 = 2;
    while (i_00 = local_30 - 1, local_30 != 0) {
      local_50 = idx;
      if (row <= idx) {
        local_50 = j;
      }
      local_60 = i_00;
      if (col <= i_00) {
        local_60 = local_30;
      }
      dVar2 = vec<3UL,_double>::operator[](this->rows + local_50,local_60);
      this_00 = mat<2UL,_2UL>::operator[](__return_storage_ptr__,idx);
      pdVar1 = vec<2UL,_double>::operator[](this_00,i_00);
      *pdVar1 = dVar2;
      local_30 = i_00;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

mat<nrows - 1, ncols - 1> get_minor(const size_t row, const size_t col) const
    {
        mat<nrows - 1, ncols - 1> ret;
        for (size_t i = nrows - 1; i--;)
            for (size_t j = ncols - 1; j--;
                 ret[i][j] = rows[i < row ? i : i + 1][j < col ? j : j + 1])
                ;
        return ret;
    }